

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O2

int func_getargs(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  char (*pacVar5) [80];
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char *stptr;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  byte bVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  
  lVar7 = (long)func_idx;
  if (lVar7 == 7) {
    stptr = "Too many nested function calls!";
  }
  else {
    ppuVar4 = __ctype_b_loc();
    do {
      pcVar18 = (char *)expr;
      expr = (uchar *)(pcVar18 + 1);
    } while (((*ppuVar4)[(byte)*pcVar18] >> 0xd & 1) != 0);
    if (*pcVar18 != 0x28) {
      return 0;
    }
    for (lVar10 = 0; iVar3 = func_idx, lVar10 != 0x2d0; lVar10 = lVar10 + 0x50) {
      func_arg[lVar7][0][lVar10] = '\0';
    }
    pacVar5 = func_arg[lVar7];
    lVar7 = (long)func_idx;
    pcVar18 = (char *)0x0;
    stptr = "Too many arguments for a function!";
    uVar12 = 0;
LAB_0010c536:
    do {
      do {
        pcVar13 = (char *)expr;
        expr = (uchar *)(pcVar13 + 1);
      } while (((*ppuVar4)[(byte)*pcVar13] >> 0xd & 1) != 0);
      bVar14 = *pcVar13;
      if (bVar14 == 0) {
LAB_0010c6d7:
        stptr = "Syntax error in function call!";
        break;
      }
      if (bVar14 == 0x29) {
        return 1;
      }
      if (bVar14 != 0x2c) {
        if (bVar14 == 0x3b) goto LAB_0010c6d7;
        uVar9 = 0;
        bVar1 = false;
        iVar6 = 0;
        lVar10 = 0;
        bVar2 = false;
        pcVar15 = (char *)expr;
        pcVar13 = (char *)expr;
LAB_0010c592:
        while( true ) {
          while( true ) {
            pcVar17 = pcVar13 + 1;
            iVar8 = (int)uVar9;
            if (bVar14 != 0) break;
            if (!bVar2) goto LAB_0010c6a1;
            bVar14 = *pcVar13;
            bVar2 = false;
            pcVar15 = pcVar15 + 1;
            pcVar13 = pcVar17;
            expr = (uchar *)pcVar17;
          }
          if (bVar14 != 0x28) break;
          iVar6 = iVar6 + 1;
LAB_0010c62f:
          if (bVar1) {
            if (bVar14 != 0x20) {
              uVar9 = (ulong)iVar8;
              lVar16 = uVar9 << 0x20;
              for (; (long)uVar9 < lVar10; uVar9 = uVar9 + 1) {
                (*(char (*) [80])*pacVar5)[uVar9] = ' ';
                lVar16 = lVar16 + 0x100000000;
              }
              lVar16 = lVar16 >> 0x20;
              goto LAB_0010c66e;
            }
LAB_0010c665:
            bVar1 = true;
          }
          else {
            if (bVar14 == 0x20) goto LAB_0010c665;
            lVar16 = (long)iVar8;
LAB_0010c66e:
            uVar9 = (ulong)((int)uVar9 + 1);
            (*(char (*) [80])*pacVar5)[lVar16] = bVar14;
            bVar1 = false;
          }
          if ((int)uVar9 == 0x50) {
            stptr = "Invalid function argument length!";
            goto LAB_0010c487;
          }
          if (bVar2) {
            pcVar13 = pcVar18;
            pcVar18 = pcVar18 + 1;
          }
          else {
            expr = (uchar *)(pcVar15 + 1);
            pcVar13 = pcVar15;
            pcVar15 = (char *)expr;
          }
          lVar10 = lVar10 + 1;
          bVar14 = *pcVar13;
          pcVar13 = pcVar15;
        }
        if (bVar14 != 0x29) {
          if (bVar14 == 0x2c) {
            if (iVar6 != 0) goto LAB_0010c62f;
            goto LAB_0010c6a1;
          }
          if (bVar14 == 0x3b) goto LAB_0010c6a1;
          if (bVar14 != 0x5c) goto LAB_0010c62f;
          if (iVar3 == 0) {
            stptr = "Syntax error!";
            break;
          }
          if ((byte)(*pcVar13 - 0x3aU) < 0xf7) {
            stptr = "Invalid function argument index!";
            expr = (uchar *)pcVar17;
            break;
          }
          pcVar18 = func_arg[lVar7 + -1][(byte)*pcVar13 - 0x31] + 1;
          bVar14 = func_arg[lVar7 + -1][(byte)*pcVar13 - 0x31][0];
          bVar2 = true;
          pcVar15 = pcVar17;
          pcVar13 = pcVar17;
          expr = (uchar *)pcVar17;
          goto LAB_0010c592;
        }
        if (iVar6 != 0) {
          iVar6 = iVar6 + -1;
          goto LAB_0010c62f;
        }
LAB_0010c6a1:
        (*(char (*) [80])*pacVar5)[iVar8] = '\0';
        expr = expr + -1;
        goto LAB_0010c536;
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      pacVar5 = func_arg[lVar7] + uVar12;
    } while (uVar11 != 9);
  }
LAB_0010c487:
  error(stptr);
  return 0;
}

Assistant:

int
func_getargs(void)
{
	char c, *ptr, *line;
	int arg, level, space, flag;
	int i, x;

	/* can not nest too much macros */
	if (func_idx == 7) {
		error("Too many nested function calls!");
		return (0);
	}

	/* skip spaces */
	while (isspace(*expr))
		expr++;

	/* function args must be enclosed in parenthesis */
	if (*expr++ != '(')
		return (0);

	/* initialize args */
    line = NULL;
	ptr  = func_arg[func_idx][0];
	arg  = 0;

	for (i = 0; i < 9; i++)
		func_arg[func_idx][i][0] = '\0';

	/* get args one by one */
	for (;;) {
		/* skip spaces */
		while (isspace(*expr))
			expr++;

		c = *expr++;
		switch (c) {
		/* empty arg */
		case ',':
			arg++;
			ptr = func_arg[func_idx][arg];
			if (arg == 9) {
				error("Too many arguments for a function!");
				return (0);
			}
			break;

		/* end of line */	
		case ';':
		case '\0':
			error("Syntax error in function call!");
			return (0);

		/* end of function */
		case ')':
			return (1);

		/* arg */
		default:
			space = 0;
			level = 0;
			flag = 0;
			i = 0;
			x = 0;
			for (;;) {
				if (c == '\0') {
					if (flag == 0)
						break;
					else {
						flag = 0;
						c = *expr++;
						continue;
					}
				}
				else if (c == ';') {
					break;
				}
				else if (c == ',') {
					if (level == 0)
						break;
				}
				else if (c == '\\') {
					if (func_idx == 0) {
						error("Syntax error!");
						return (0);
					}
					c = *expr++;
					if (c < '1' || c > '9') {
						error("Invalid function argument index!");
						return (0);
					}
					line = func_arg[func_idx - 1][c - '1'];
					flag = 1;
					c = *line++;
					continue;
				}
				else if (c == '(') {
					level++;
				}
				else if (c == ')') {
					if (level == 0)
						break;
					level--;
				}
				if (space) {
					if (c != ' ') {
						while (i < x)
							ptr[i++] = ' ';
						ptr[i++] = c;
						space = 0;
					}
				}
				else if (c == ' ') {
					space = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Invalid function argument length!");
					return (0);
				}
				x++;
				if (flag)
					c = *line++;
				else
					c = *expr++;
			}
			ptr[i] = '\0';
			expr--;
			break;
		}
	}
}